

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcDoorStyle::IfcDoorStyle(IfcDoorStyle *this)

{
  IfcDoorStyle *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1d8,"IfcDoorStyle");
  IfcTypeProduct::IfcTypeProduct(&this->super_IfcTypeProduct,&PTR_construction_vtable_24__00fe7670);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDoorStyle,_4UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDoorStyle,_4UL> *)
             &(this->super_IfcTypeProduct).field_0x148,&PTR_construction_vtable_24__00fe7720);
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject = 0xfe7590;
  *(undefined8 *)&this->field_0x1d8 = 0xfe7658;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 = 0xfe75b8;
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xfe75e0;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 = 0xfe7608;
  *(undefined8 *)&(this->super_IfcTypeProduct).field_0x148 = 0xfe7630;
  std::__cxx11::string::string((string *)&(this->super_IfcTypeProduct).field_0x158);
  std::__cxx11::string::string((string *)&this->ConstructionType);
  std::__cxx11::string::string((string *)&this->ParameterTakesPrecedence);
  std::__cxx11::string::string((string *)&this->Sizeable);
  return;
}

Assistant:

IfcDoorStyle() : Object("IfcDoorStyle") {}